

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int gz_comp(gz_statep state,int flush)

{
  int iVar1;
  ssize_t sVar2;
  Bytef *pBVar3;
  int *piVar4;
  char *msg;
  ulong uVar5;
  uInt uVar6;
  uInt uVar7;
  
  if ((state->size == 0) && (iVar1 = gz_init(state), iVar1 == -1)) {
    return -1;
  }
  uVar6 = (state->strm).avail_out;
  iVar1 = 0;
  do {
    if (uVar6 == 0) {
LAB_004af2d9:
      uVar5 = (long)(state->strm).next_out - (long)state->next;
      iVar1 = (int)uVar5;
      if (iVar1 != 0) {
        sVar2 = write(state->fd,state->next,uVar5 & 0xffffffff);
        if (((int)sVar2 < 0) || ((int)sVar2 != iVar1)) {
          piVar4 = __errno_location();
          msg = strerror(*piVar4);
          gz_error(state,-1,msg);
          return -1;
        }
        uVar6 = (state->strm).avail_out;
      }
      if (uVar6 == 0) {
        uVar7 = state->size;
        (state->strm).avail_out = uVar7;
        pBVar3 = state->out;
        (state->strm).next_out = pBVar3;
      }
      else {
        pBVar3 = (state->strm).next_out;
        uVar7 = uVar6;
      }
      state->next = pBVar3;
    }
    else {
      uVar7 = uVar6;
      if ((flush != 0) && (flush != 4 || iVar1 == 1)) goto LAB_004af2d9;
    }
    iVar1 = deflate((z_streamp_conflict)&state->strm,flush);
    if (iVar1 == -2) {
      gz_error(state,-2,"internal error: deflate stream corrupt");
      return -1;
    }
    uVar6 = (state->strm).avail_out;
    if (uVar7 == uVar6) {
      if (flush == 4) {
        deflateReset((z_streamp_conflict)&state->strm);
      }
      return 0;
    }
  } while( true );
}

Assistant:

local int gz_comp(gz_statep state, int flush)
{
    int ret, got;
    unsigned have;
    z_streamp strm = &(state->strm);

    /* allocate memory if this is the first time through */
    if (state->size == 0 && gz_init(state) == -1)
        return -1;

    /* run deflate() on provided input until it produces no more output */
    ret = Z_OK;
    do {
        /* write out current buffer contents if full, or if flushing, but if
           doing Z_FINISH then don't write until we get to Z_STREAM_END */
        if (strm->avail_out == 0 || (flush != Z_NO_FLUSH &&
            (flush != Z_FINISH || ret == Z_STREAM_END))) {
            have = (unsigned)(strm->next_out - state->next);
            if (have && ((got = write(state->fd, state->next, have)) < 0 ||
                         (unsigned)got != have)) {
                gz_error(state, Z_ERRNO, zstrerror());
                return -1;
            }
            if (strm->avail_out == 0) {
                strm->avail_out = state->size;
                strm->next_out = state->out;
            }
            state->next = strm->next_out;
        }

        /* compress */
        have = strm->avail_out;
        ret = deflate(strm, flush);
        if (ret == Z_STREAM_ERROR) {
            gz_error(state, Z_STREAM_ERROR,
                      "internal error: deflate stream corrupt");
            return -1;
        }
        have -= strm->avail_out;
    } while (have);

    /* if that completed a deflate stream, allow another to start */
    if (flush == Z_FINISH)
        deflateReset(strm);

    /* all done, no errors */
    return 0;
}